

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_boundary.c
# Opt level: O0

mpt_value * iterBoundaryValue(mpt_iterator *it)

{
  _mpt_vptr_iterator *local_28;
  double *val;
  mpt_iteratorBoundary *d;
  mpt_iterator *it_local;
  
  if (*(uint *)((long)&it[6]._vptr + 4) < *(uint *)&it[6]._vptr) {
    if (*(int *)((long)&it[6]._vptr + 4) == 0) {
      local_28 = (_mpt_vptr_iterator *)(it + 3);
    }
    else if (*(uint *)((long)&it[6]._vptr + 4) < *(int *)&it[6]._vptr - 1U) {
      local_28 = (_mpt_vptr_iterator *)(it + 4);
    }
    else {
      local_28 = (_mpt_vptr_iterator *)(it + 5);
    }
    it[1]._vptr = local_28;
    it[2]._vptr = (_mpt_vptr_iterator *)0x64;
    it_local = it + 1;
  }
  else {
    it_local = (mpt_iterator *)0x0;
  }
  return (mpt_value *)it_local;
}

Assistant:

static const MPT_STRUCT(value) *iterBoundaryValue(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorBoundary) *d = MPT_baseaddr(iteratorBoundary, it, _it);
	const double *val;
	
	if (d->pos >= d->elem) {
		return 0;
	}
	if (!d->pos) {
		val = &d->left;
	}
	else if (d->pos < (d->elem - 1)) {
		val = &d->inter;
	}
	else {
		val = &d->right;
	}
	MPT_value_set(&d->val, 'd', val);
	
	return &d->val;
}